

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O0

QString * QSqlQueryModelSql::orderBy(QString *s)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QString *this;
  QString *in_stack_ffffffffffffffe0;
  QString *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar2 = QString::isEmpty((QString *)0x15e716);
  if (bVar2) {
    QString::QString(this,in_RDI);
  }
  else {
    QVar3 = orderBy();
    latin1.m_data = (char *)in_stack_ffffffffffffffe8;
    latin1.m_size = (qsizetype)in_stack_ffffffffffffffe0;
    QString::QString((QString *)QVar3.m_size,latin1);
    concat(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    QString::~QString((QString *)0x15e77f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline const static QString orderBy(const QString &s) { return s.isEmpty() ? s : concat(orderBy(), s); }